

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_heuristics.cpp
# Opt level: O3

idx_t duckdb::ExpressionHeuristics::ExpressionCost
                (BoundOperatorExpression *expr,ExpressionType expr_type)

{
  pointer puVar1;
  type expr_00;
  idx_t iVar2;
  long lVar3;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *child;
  pointer this;
  
  puVar1 = (expr->children).
           super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar3 = 0;
  for (this = (expr->children).
              super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start; this != puVar1; this = this + 1) {
    expr_00 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator*(this);
    iVar2 = Cost(expr_00);
    lVar3 = lVar3 + iVar2;
  }
  if ((expr_type & 0xfe) == OPERATOR_IS_NULL) {
    iVar2 = lVar3 + 5;
  }
  else if ((byte)(expr_type - COMPARE_IN) < 2) {
    iVar2 = (lVar3 + ((long)(expr->children).
                            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                            .
                            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(expr->children).
                            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                            .
                            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) * 100) - 100;
  }
  else if (expr_type == OPERATOR_NOT) {
    iVar2 = lVar3 + 10;
  }
  else {
    iVar2 = lVar3 + 1000;
  }
  return iVar2;
}

Assistant:

idx_t ExpressionHeuristics::ExpressionCost(BoundOperatorExpression &expr, ExpressionType expr_type) {
	idx_t sum = 0;
	for (auto &child : expr.children) {
		sum += Cost(*child);
	}

	// OPERATOR_IS_NULL, OPERATOR_IS_NOT_NULL
	if (expr_type == ExpressionType::OPERATOR_IS_NULL || expr_type == ExpressionType::OPERATOR_IS_NOT_NULL) {
		return sum + 5;
	} else if (expr_type == ExpressionType::COMPARE_IN || expr_type == ExpressionType::COMPARE_NOT_IN) {
		// COMPARE_IN, COMPARE_NOT_IN
		return sum + (expr.children.size() - 1) * 100;
	} else if (expr_type == ExpressionType::OPERATOR_NOT) {
		// OPERATOR_NOT
		return sum + 10; // TODO: evaluate via measured runtimes
	} else {
		return sum + 1000;
	}
}